

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetPluginTest.cpp
# Opt level: O0

void __thiscall
TEST_SetPointerPluginTest_installTwoFunctionPointer_Test::testBody
          (TEST_SetPointerPluginTest_installTwoFunctionPointer_Test *this)

{
  TestRegistry *pTVar1;
  FunctionPointerUtestShell *this_00;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  size_t sVar4;
  bool bVar5;
  FunctionPointerUtestShell *tst;
  TEST_SetPointerPluginTest_installTwoFunctionPointer_Test *this_local;
  
  this_00 = (FunctionPointerUtestShell *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
                         ,0x4f);
  (this_00->super_UtestShell).lineNumber_ = 0;
  (this_00->super_UtestShell).next_ = (UtestShell *)0x0;
  (this_00->super_UtestShell).name_ = (char *)0x0;
  (this_00->super_UtestShell).file_ = (char *)0x0;
  (this_00->super_UtestShell)._vptr_UtestShell = (_func_int **)0x0;
  (this_00->super_UtestShell).group_ = (char *)0x0;
  (this_00->super_UtestShell).isRunAsSeperateProcess_ = false;
  (this_00->super_UtestShell).hasFailed_ = false;
  *(undefined6 *)&(this_00->super_UtestShell).field_0x32 = 0;
  FunctionPointerUtestShell::FunctionPointerUtestShell(this_00);
  fp1 = orig_func1;
  fp2 = orig_func2;
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).myRegistry_;
  (*pTVar1->_vptr_TestRegistry[2])(pTVar1,this_00);
  pTVar1 = (this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).myRegistry_;
  (*pTVar1->_vptr_TestRegistry[5])
            (pTVar1,(this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).result_);
  pUVar2 = UtestShell::getCurrent();
  bVar5 = fp1 == orig_func1;
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar5,"CHECK","fp1 == orig_func1",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
             ,0x55,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  bVar5 = fp2 == orig_func2;
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar5,"CHECK","fp2 == orig_func2",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
             ,0x56,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  sVar4 = TestResult::getFailureCount
                    ((this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).result_);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,0,sVar4,"LONGS_EQUAL(0, result_->getFailureCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
             ,0x57,pTVar3);
  pUVar2 = UtestShell::getCurrent();
  sVar4 = TestResult::getCheckCount
                    ((this->super_TEST_GROUP_CppUTestGroupSetPointerPluginTest).result_);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[0xe])
            (pUVar2,2,sVar4,"LONGS_EQUAL(2, result_->getCheckCount()) failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SetPluginTest.cpp"
             ,0x58,pTVar3);
  if (this_00 != (FunctionPointerUtestShell *)0x0) {
    (*(this_00->super_UtestShell)._vptr_UtestShell[1])();
  }
  return;
}

Assistant:

TEST(SetPointerPluginTest, installTwoFunctionPointer)
{
    FunctionPointerUtestShell *tst = new FunctionPointerUtestShell();

    fp1 = orig_func1;
    fp2 = orig_func2;
    myRegistry_->addTest(tst);
    myRegistry_->runAllTests(*result_);
    CHECK(fp1 == orig_func1);
    CHECK(fp2 == orig_func2);
    LONGS_EQUAL(0, result_->getFailureCount());
    LONGS_EQUAL(2, result_->getCheckCount());
    delete tst;
}